

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Swap_Test<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Swap_Test<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  Message *message;
  HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *this_01;
  size_type expected_max_items;
  key_equal *eql;
  hasher hVar2;
  int i_2;
  TypeParam empty_ht;
  int i_1;
  TypeParam swap_to_clear_ht;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  size_type expected_buckets;
  int i;
  TypeParam other_ht;
  hasher hasher;
  undefined4 in_stack_fffffffffffff3e8;
  int in_stack_fffffffffffff3ec;
  HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff3f0;
  char **in_stack_fffffffffffff3f8;
  int index;
  HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff400;
  key_equal *in_stack_fffffffffffff408;
  hasher *in_stack_fffffffffffff410;
  size_type in_stack_fffffffffffff418;
  Type type;
  HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffff420;
  Message *in_stack_fffffffffffff468;
  AssertHelper *in_stack_fffffffffffff470;
  value_type *in_stack_fffffffffffff528;
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff530;
  int local_92c;
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> local_920;
  Hasher local_910;
  Hasher local_904 [22];
  HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *local_7f8;
  int local_7ec;
  key_equal *local_7e8;
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> local_7e0;
  Hasher local_7d0;
  Hasher local_7c4 [16];
  HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *local_700;
  size_type local_6f8;
  undefined4 local_6ec;
  AssertionResult local_6e8 [2];
  key_type local_6c8;
  size_type local_6c0;
  undefined4 local_6b4;
  AssertionResult local_6b0 [2];
  size_type local_690;
  undefined4 local_684;
  AssertionResult local_680 [2];
  size_type local_660;
  undefined4 local_654;
  AssertionResult local_650 [2];
  Message *local_630;
  int local_628;
  Message *local_620;
  int local_618;
  int local_610;
  undefined4 local_60c;
  AssertionResult local_608 [2];
  hasher local_5e8;
  hasher local_5d8;
  int local_5c8;
  undefined4 local_5c4;
  AssertionResult local_5c0 [2];
  key_type local_5a0;
  key_type local_598;
  AssertionResult local_590 [2];
  key_type local_570;
  key_type local_568;
  AssertionResult local_560 [2];
  key_type local_540;
  size_type local_538;
  undefined4 local_52c;
  AssertionResult local_528 [2];
  key_type local_508;
  size_type local_500;
  undefined4 local_4f4;
  AssertionResult local_4f0 [2];
  key_type local_4d0;
  size_type local_4c8;
  undefined4 local_4bc;
  AssertionResult local_4b8 [2];
  key_type local_498;
  size_type local_490;
  undefined4 local_484;
  AssertionResult local_480 [2];
  key_type local_460;
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *local_458;
  undefined4 local_44c;
  AssertionResult local_448 [2];
  key_type local_428;
  size_type local_420;
  undefined4 local_414;
  AssertionResult local_410 [2];
  size_type local_3f0;
  undefined4 local_3e4;
  AssertionResult local_3e0 [2];
  size_type local_3c0;
  undefined4 local_3b4;
  AssertionResult local_3b0 [2];
  undefined4 local_38c;
  size_type local_388;
  AssertionResult local_380 [2];
  size_type local_360;
  AssertionResult local_358 [2];
  key_equal local_338;
  key_equal local_328;
  int local_318;
  undefined4 local_314;
  AssertionResult local_310 [2];
  key_equal local_2f0;
  key_equal local_2e0;
  int local_2d0;
  undefined4 local_2cc;
  AssertionResult local_2c8 [2];
  hasher local_2a8;
  hasher local_298;
  int local_288;
  undefined4 local_284;
  AssertionResult local_280 [2];
  hasher local_260;
  hasher local_250;
  int local_240;
  undefined4 local_23c;
  AssertionResult local_238 [2];
  key_type local_218;
  key_type local_210;
  AssertionResult local_208 [2];
  key_type local_1e8;
  key_type local_1e0;
  AssertionResult local_1d8;
  size_type local_1c8;
  value_type local_168;
  key_type local_160;
  value_type local_100;
  int local_f4;
  key_type local_f0;
  key_type local_e8;
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> local_d0 [11];
  Hasher local_14;
  
  Hasher::Hasher(&local_14,1);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::Alloc(local_d0,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashtable
            (in_stack_fffffffffffff420,in_stack_fffffffffffff418,in_stack_fffffffffffff410,
             in_stack_fffffffffffff408,(allocator_type *)in_stack_fffffffffffff400);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::~Alloc(local_d0);
  local_e8 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffff400,(int)((ulong)in_stack_fffffffffffff3f8 >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffff3f0,
                    (key_type *)CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8));
  local_f0 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffff400,(int)((ulong)in_stack_fffffffffffff3f8 >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffff3f0,
                    (key_type *)CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8));
  for (local_f4 = 3; type = (Type)(in_stack_fffffffffffff418 >> 0x20), local_f4 < 2000;
      local_f4 = local_f4 + 1) {
    local_100 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffff3f0,in_stack_fffffffffffff3ec);
    google::
    BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff530,in_stack_fffffffffffff528);
  }
  local_160 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff400,(int)((ulong)in_stack_fffffffffffff3f8 >> 0x20))
  ;
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *)in_stack_fffffffffffff3f0,
          (key_type *)CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8));
  local_168 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff3f0,in_stack_fffffffffffff3ec);
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff530,in_stack_fffffffffffff528);
  local_1c8 = google::
              BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xc0075c);
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::swap((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          *)in_stack_fffffffffffff3f0,
         (BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          *)CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8));
  local_1e0 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff400,(int)((ulong)in_stack_fffffffffffff3f8 >> 0x20))
  ;
  local_1e8 = google::
              BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::deleted_key((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xc007bc);
  testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
            ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
             in_stack_fffffffffffff3f8,(char **)in_stack_fffffffffffff3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff420);
    testing::AssertionResult::failure_message((AssertionResult *)0xc00837);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff420,type,(char *)in_stack_fffffffffffff410,
               (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff470,in_stack_fffffffffffff468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff3f0);
    testing::Message::~Message((Message *)0xc0089a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc0090b);
  local_210 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff400,(int)((ulong)in_stack_fffffffffffff3f8 >> 0x20))
  ;
  local_218 = google::
              BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::deleted_key((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xc00944);
  testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
            ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
             in_stack_fffffffffffff3f8,(char **)in_stack_fffffffffffff3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_208);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff420);
    testing::AssertionResult::failure_message((AssertionResult *)0xc009d1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff420,type,(char *)in_stack_fffffffffffff410,
               (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff470,in_stack_fffffffffffff468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff3f0);
    testing::Message::~Message((Message *)0xc00a34);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc00aa5);
  local_23c = 1;
  local_260 = google::
              BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                            *)in_stack_fffffffffffff400);
  local_250 = local_260;
  local_240 = Hasher::id(&local_250);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
             (int *)in_stack_fffffffffffff3f8,(int *)in_stack_fffffffffffff3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_238);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff420);
    testing::AssertionResult::failure_message((AssertionResult *)0xc00b95);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff420,type,(char *)in_stack_fffffffffffff410,
               (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff470,in_stack_fffffffffffff468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff3f0);
    testing::Message::~Message((Message *)0xc00bf8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc00c69);
  local_284 = 0;
  local_2a8 = google::
              BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                            *)in_stack_fffffffffffff400);
  local_298 = local_2a8;
  local_288 = Hasher::id(&local_298);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
             (int *)in_stack_fffffffffffff3f8,(int *)in_stack_fffffffffffff3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_280);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff420);
    testing::AssertionResult::failure_message((AssertionResult *)0xc00d55);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff420,type,(char *)in_stack_fffffffffffff410,
               (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff470,in_stack_fffffffffffff468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff3f0);
    testing::Message::~Message((Message *)0xc00db8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc00e29);
  local_2cc = 1;
  local_2f0 = google::
              BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff400);
  local_2e0 = local_2f0;
  local_2d0 = Hasher::id(&local_2e0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
             (int *)in_stack_fffffffffffff3f8,(int *)in_stack_fffffffffffff3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff420);
    testing::AssertionResult::failure_message((AssertionResult *)0xc00f19);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff420,type,(char *)in_stack_fffffffffffff410,
               (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff470,in_stack_fffffffffffff468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff3f0);
    testing::Message::~Message((Message *)0xc00f7c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc00fed);
  local_314 = 0;
  local_338 = google::
              BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff400);
  local_328 = local_338;
  local_318 = Hasher::id(&local_328);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
             (int *)in_stack_fffffffffffff3f8,(int *)in_stack_fffffffffffff3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_310);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff420);
    testing::AssertionResult::failure_message((AssertionResult *)0xc010d9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff420,type,(char *)in_stack_fffffffffffff410,
               (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff470,in_stack_fffffffffffff468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff3f0);
    testing::Message::~Message((Message *)0xc0113c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc011aa);
  local_360 = google::
              BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xc011bb);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
             (unsigned_long *)in_stack_fffffffffffff3f8,(unsigned_long *)in_stack_fffffffffffff3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_358);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff420);
    testing::AssertionResult::failure_message((AssertionResult *)0xc01236);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff420,type,(char *)in_stack_fffffffffffff410,
               (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff470,in_stack_fffffffffffff468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff3f0);
    testing::Message::~Message((Message *)0xc01299);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc01307);
  local_388 = google::
              BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xc01314);
  local_38c = 200;
  testing::internal::CmpHelperGT<unsigned_long,unsigned_int>
            ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
             (unsigned_long *)in_stack_fffffffffffff3f8,(uint *)in_stack_fffffffffffff3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_380);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff420);
    testing::AssertionResult::failure_message((AssertionResult *)0xc0139a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff420,type,(char *)in_stack_fffffffffffff410,
               (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff470,in_stack_fffffffffffff468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff3f0);
    testing::Message::~Message((Message *)0xc013fd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc0146b);
  local_3b4 = 1;
  local_3c0 = google::
              BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xc01487);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
             (uint *)in_stack_fffffffffffff3f8,(unsigned_long *)in_stack_fffffffffffff3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff420);
    testing::AssertionResult::failure_message((AssertionResult *)0xc01502);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff420,type,(char *)in_stack_fffffffffffff410,
               (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff470,in_stack_fffffffffffff468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff3f0);
    testing::Message::~Message((Message *)0xc01565);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc015d3);
  local_3e4 = 0x7cc;
  local_3f0 = google::
              BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xc015eb);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
             (uint *)in_stack_fffffffffffff3f8,(unsigned_long *)in_stack_fffffffffffff3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3e0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff420);
    testing::AssertionResult::failure_message((AssertionResult *)0xc01666);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff420,type,(char *)in_stack_fffffffffffff410,
               (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff470,in_stack_fffffffffffff468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff3f0);
    testing::Message::~Message((Message *)0xc016c9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc0173a);
  local_414 = 0;
  local_428 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff400,(int)((ulong)in_stack_fffffffffffff3f8 >> 0x20))
  ;
  local_420 = google::
              BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff3f0,
                      (key_type *)CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
             (uint *)in_stack_fffffffffffff3f8,(unsigned_long *)in_stack_fffffffffffff3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_410);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff420);
    testing::AssertionResult::failure_message((AssertionResult *)0xc01822);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff420,type,(char *)in_stack_fffffffffffff410,
               (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff470,in_stack_fffffffffffff468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff3f0);
    testing::Message::~Message((Message *)0xc01885);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc018f6);
  local_44c = 1;
  local_460 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff400,(int)((ulong)in_stack_fffffffffffff3f8 >> 0x20))
  ;
  this_00 = (BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             *)google::
               BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::count((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff3f0,
                       (key_type *)CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8));
  local_458 = this_00;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
             (uint *)in_stack_fffffffffffff3f8,(unsigned_long *)in_stack_fffffffffffff3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_448);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff420);
    in_stack_fffffffffffff528 =
         (value_type *)testing::AssertionResult::failure_message((AssertionResult *)0xc019cf);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff420,type,(char *)in_stack_fffffffffffff410,
               (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff470,in_stack_fffffffffffff468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff3f0);
    testing::Message::~Message((Message *)0xc01a32);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc01aa3);
  local_484 = 1;
  local_498 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff400,(int)((ulong)in_stack_fffffffffffff3f8 >> 0x20))
  ;
  local_490 = google::
              BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff3f0,
                      (key_type *)CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
             (uint *)in_stack_fffffffffffff3f8,(unsigned_long *)in_stack_fffffffffffff3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_480);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff420);
    testing::AssertionResult::failure_message((AssertionResult *)0xc01b8b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff420,type,(char *)in_stack_fffffffffffff410,
               (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff470,in_stack_fffffffffffff468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff3f0);
    testing::Message::~Message((Message *)0xc01bee);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc01c5f);
  local_4bc = 0;
  local_4d0 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff400,(int)((ulong)in_stack_fffffffffffff3f8 >> 0x20))
  ;
  local_4c8 = google::
              BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff3f0,
                      (key_type *)CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
             (uint *)in_stack_fffffffffffff3f8,(unsigned_long *)in_stack_fffffffffffff3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff420);
    testing::AssertionResult::failure_message((AssertionResult *)0xc01d38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff420,type,(char *)in_stack_fffffffffffff410,
               (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff470,in_stack_fffffffffffff468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff3f0);
    testing::Message::~Message((Message *)0xc01d9b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc01e0c);
  local_4f4 = 0;
  local_508 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff400,(int)((ulong)in_stack_fffffffffffff3f8 >> 0x20))
  ;
  local_500 = google::
              BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff3f0,
                      (key_type *)CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
             (uint *)in_stack_fffffffffffff3f8,(unsigned_long *)in_stack_fffffffffffff3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4f0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff420);
    testing::AssertionResult::failure_message((AssertionResult *)0xc01ef4);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff420,type,(char *)in_stack_fffffffffffff410,
               (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff470,in_stack_fffffffffffff468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff3f0);
    testing::Message::~Message((Message *)0xc01f57);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc01fc8);
  local_52c = 0;
  local_540 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff400,(int)((ulong)in_stack_fffffffffffff3f8 >> 0x20))
  ;
  local_538 = google::
              BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff3f0,
                      (key_type *)CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
             (uint *)in_stack_fffffffffffff3f8,(unsigned_long *)in_stack_fffffffffffff3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_528);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff420);
    testing::AssertionResult::failure_message((AssertionResult *)0xc020a1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff420,type,(char *)in_stack_fffffffffffff410,
               (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff470,in_stack_fffffffffffff468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff3f0);
    testing::Message::~Message((Message *)0xc02104);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc02175);
  google::
  swap<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
            ((HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)in_stack_fffffffffffff3f0,
             (HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8));
  local_568 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff400,(int)((ulong)in_stack_fffffffffffff3f8 >> 0x20))
  ;
  local_570 = google::
              BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::deleted_key((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xc021cd);
  testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
            ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
             in_stack_fffffffffffff3f8,(char **)in_stack_fffffffffffff3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_560);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff420);
    testing::AssertionResult::failure_message((AssertionResult *)0xc0225a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff420,type,(char *)in_stack_fffffffffffff410,
               (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff470,in_stack_fffffffffffff468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff3f0);
    testing::Message::~Message((Message *)0xc022bd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc0232e);
  local_598 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff400,(int)((ulong)in_stack_fffffffffffff3f8 >> 0x20))
  ;
  local_5a0 = google::
              BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::deleted_key((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xc02367);
  testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
            ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
             in_stack_fffffffffffff3f8,(char **)in_stack_fffffffffffff3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_590);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff420);
    testing::AssertionResult::failure_message((AssertionResult *)0xc023f4);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff420,type,(char *)in_stack_fffffffffffff410,
               (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff470,in_stack_fffffffffffff468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff3f0);
    testing::Message::~Message((Message *)0xc02457);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc024c8);
  local_5c4 = 0;
  local_5e8 = google::
              BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                            *)in_stack_fffffffffffff400);
  local_5d8 = local_5e8;
  local_5c8 = Hasher::id(&local_5d8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
             (int *)in_stack_fffffffffffff3f8,(int *)in_stack_fffffffffffff3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5c0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff420);
    in_stack_fffffffffffff470 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xc025b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff420,type,(char *)in_stack_fffffffffffff410,
               (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff470,in_stack_fffffffffffff468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff3f0);
    testing::Message::~Message((Message *)0xc0261b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc0268c);
  local_60c = 1;
  hVar2 = google::
          BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::hash_funct((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff400);
  local_628 = hVar2.num_compares_;
  message = hVar2._0_8_;
  local_630 = message;
  local_620 = message;
  local_618 = local_628;
  local_610 = Hasher::id((Hasher *)&local_620);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
             (int *)in_stack_fffffffffffff3f8,(int *)in_stack_fffffffffffff3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_608);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff420);
    testing::AssertionResult::failure_message((AssertionResult *)0xc02772);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff420,type,(char *)in_stack_fffffffffffff410,
               (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff470,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff3f0);
    testing::Message::~Message((Message *)0xc027cf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc0283d);
  local_654 = 0x7cc;
  local_660 = google::
              BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xc02859);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
             (uint *)in_stack_fffffffffffff3f8,(unsigned_long *)in_stack_fffffffffffff3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_650);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff420);
    testing::AssertionResult::failure_message((AssertionResult *)0xc028d4);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff420,type,(char *)in_stack_fffffffffffff410,
               (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff470,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff3f0);
    testing::Message::~Message((Message *)0xc02931);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc0299f);
  local_684 = 1;
  local_690 = google::
              BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xc029b7);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
             (uint *)in_stack_fffffffffffff3f8,(unsigned_long *)in_stack_fffffffffffff3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_680);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff420);
    testing::AssertionResult::failure_message((AssertionResult *)0xc02a32);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff420,type,(char *)in_stack_fffffffffffff410,
               (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff470,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff3f0);
    testing::Message::~Message((Message *)0xc02a8f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc02b00);
  local_6b4 = 1;
  local_6c8 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff400,(int)((ulong)in_stack_fffffffffffff3f8 >> 0x20))
  ;
  local_6c0 = google::
              BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff3f0,
                      (key_type *)CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
             (uint *)in_stack_fffffffffffff3f8,(unsigned_long *)in_stack_fffffffffffff3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_6b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff420);
    testing::AssertionResult::failure_message((AssertionResult *)0xc02bd6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff420,type,(char *)in_stack_fffffffffffff410,
               (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff470,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff3f0);
    testing::Message::~Message((Message *)0xc02c33);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc02ca4);
  local_6ec = 0;
  this_01 = (HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
             *)HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffff400,(int)((ulong)in_stack_fffffffffffff3f8 >> 0x20)
                          );
  local_700 = this_01;
  expected_max_items =
       google::
       BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       ::count((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                *)in_stack_fffffffffffff3f0,
               (key_type *)CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8));
  local_6f8 = expected_max_items;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
             (uint *)in_stack_fffffffffffff3f8,(unsigned_long *)in_stack_fffffffffffff3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_6e8);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    in_stack_fffffffffffff410 =
         (hasher *)testing::AssertionResult::failure_message((AssertionResult *)0xc02d71);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_01,(Type)(expected_max_items >> 0x20),
               (char *)in_stack_fffffffffffff410,(int)((ulong)in_stack_fffffffffffff408 >> 0x20),
               (char *)in_stack_fffffffffffff400);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff470,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff3f0);
    testing::Message::~Message((Message *)0xc02dce);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc02e3f);
  Hasher::Hasher(local_7c4,0);
  Hasher::Hasher(&local_7d0,0);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::Alloc(&local_7e0,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashtable
            (this_01,expected_max_items,in_stack_fffffffffffff410,in_stack_fffffffffffff408,
             (allocator_type *)in_stack_fffffffffffff400);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_7e0);
  eql = (key_equal *)
        HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
        ::UniqueKey(in_stack_fffffffffffff400,(int)((ulong)in_stack_fffffffffffff3f8 >> 0x20));
  local_7e8 = eql;
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffff3f0,
                    (key_type *)CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8));
  for (local_7ec = 2; index = (int)((ulong)in_stack_fffffffffffff3f8 >> 0x20), local_7ec < 10000;
      local_7ec = local_7ec + 1) {
    in_stack_fffffffffffff400 =
         (HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          *)HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueObject(in_stack_fffffffffffff3f0,in_stack_fffffffffffff3ec);
    local_7f8 = in_stack_fffffffffffff400;
    google::
    BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(this_00,in_stack_fffffffffffff528);
  }
  Hasher::Hasher(local_904,0);
  Hasher::Hasher(&local_910,0);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::Alloc(&local_920,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashtable
            (this_01,expected_max_items,in_stack_fffffffffffff410,eql,
             (allocator_type *)in_stack_fffffffffffff400);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_920);
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::swap((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          *)in_stack_fffffffffffff3f0,
         (BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          *)CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8));
  HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_fffffffffffff400,index);
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffff3f0,
                    (key_type *)CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8));
  for (local_92c = 2; local_92c < 10000; local_92c = local_92c + 1) {
    in_stack_fffffffffffff3f0 =
         (HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          *)HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueObject(in_stack_fffffffffffff3f0,in_stack_fffffffffffff3ec);
    google::
    BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(this_00,in_stack_fffffffffffff528);
  }
  google::
  HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)0xc0313e);
  google::
  HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)0xc0314b);
  google::
  HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)0xc03158);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Swap) {
  // Let's make a second hashtable with its own hasher, key_equal, etc.
  typename TypeParam::hasher hasher(1);  // 1 is a unique id
  TypeParam other_ht(200, hasher, hasher);

  this->ht_.set_deleted_key(this->UniqueKey(1));
  other_ht.set_deleted_key(this->UniqueKey(2));

  for (int i = 3; i < 2000; i++) {
    this->ht_.insert(this->UniqueObject(i));
  }
  this->ht_.erase(this->UniqueKey(1000));
  other_ht.insert(this->UniqueObject(2001));
  typename TypeParam::size_type expected_buckets = other_ht.bucket_count();

  this->ht_.swap(other_ht);

  EXPECT_EQ(this->UniqueKey(2), this->ht_.deleted_key());
  EXPECT_EQ(this->UniqueKey(1), other_ht.deleted_key());

  EXPECT_EQ(1, this->ht_.hash_funct().id());
  EXPECT_EQ(0, other_ht.hash_funct().id());

  EXPECT_EQ(1, this->ht_.key_eq().id());
  EXPECT_EQ(0, other_ht.key_eq().id());

  EXPECT_EQ(expected_buckets, this->ht_.bucket_count());
  EXPECT_GT(other_ht.bucket_count(), 200u);

  EXPECT_EQ(1u, this->ht_.size());
  EXPECT_EQ(1996u, other_ht.size());  // because we erased 1000

  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(111)));
  EXPECT_EQ(1u, other_ht.count(this->UniqueKey(111)));
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(2001)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(2001)));
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(1000)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(1000)));

// We purposefully don't swap allocs -- they're not necessarily swappable.

// Now swap back, using the free-function swap
// NOTE: MSVC seems to have trouble with this free swap, not quite
// sure why.  I've given up trying to fix it though.
#ifdef _MSC_VER
  other_ht.swap(this->ht_);
#else
  swap(this->ht_, other_ht);
#endif

  EXPECT_EQ(this->UniqueKey(1), this->ht_.deleted_key());
  EXPECT_EQ(this->UniqueKey(2), other_ht.deleted_key());
  EXPECT_EQ(0, this->ht_.hash_funct().id());
  EXPECT_EQ(1, other_ht.hash_funct().id());
  EXPECT_EQ(1996u, this->ht_.size());
  EXPECT_EQ(1u, other_ht.size());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(111)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(111)));

  // A user reported a crash with this code using swap to clear.
  // We've since fixed the bug; this prevents a regression.
  TypeParam swap_to_clear_ht;
  swap_to_clear_ht.set_deleted_key(this->UniqueKey(1));
  for (int i = 2; i < 10000; ++i) {
    swap_to_clear_ht.insert(this->UniqueObject(i));
  }
  TypeParam empty_ht;
  empty_ht.swap(swap_to_clear_ht);
  swap_to_clear_ht.set_deleted_key(this->UniqueKey(1));
  for (int i = 2; i < 10000; ++i) {
    swap_to_clear_ht.insert(this->UniqueObject(i));
  }
}